

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_state_starttls_resp(connectdata *conn,int smtpcode,smtpstate instate)

{
  Curl_easy *data;
  CURLcode result;
  smtpstate instate_local;
  int smtpcode_local;
  connectdata *conn_local;
  
  if (smtpcode == 0xdc) {
    data._4_4_ = smtp_perform_upgrade_tls(conn);
  }
  else if ((conn->data->set).use_ssl == CURLUSESSL_TRY) {
    data._4_4_ = smtp_perform_authentication(conn);
  }
  else {
    Curl_failf(conn->data,"STARTTLS denied, code %d",(ulong)(uint)smtpcode);
    data._4_4_ = CURLE_USE_SSL_FAILED;
  }
  return data._4_4_;
}

Assistant:

static CURLcode smtp_state_starttls_resp(struct connectdata *conn,
                                         int smtpcode,
                                         smtpstate instate)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;

  (void)instate; /* no use for this yet */

  if(smtpcode != 220) {
    if(data->set.use_ssl != CURLUSESSL_TRY) {
      failf(data, "STARTTLS denied, code %d", smtpcode);
      result = CURLE_USE_SSL_FAILED;
    }
    else
      result = smtp_perform_authentication(conn);
  }
  else
    result = smtp_perform_upgrade_tls(conn);

  return result;
}